

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.h
# Opt level: O2

void __thiscall
TypedImageChannel<float>::resize(TypedImageChannel<float> *this,int width,int height)

{
  Imf_3_2::Array2D<float>::resizeEraseUnsafe(&this->_pixels,(long)height,(long)width);
  return;
}

Assistant:

void
TypedImageChannel<T>::resize (int width, int height)
{
    _pixels.resizeEraseUnsafe (height, width);
}